

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O3

void __thiscall helics::apps::Player::generatePublications(Player *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *p_Var2;
  string_view typeName;
  DataType type;
  iterator iVar3;
  size_t unaff_RBX;
  _Hash_node_base *p_Var4;
  char *unaff_R12;
  string_view name;
  key_type local_40;
  
  p_Var4 = (this->tags)._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    do {
      local_40._M_str = (char *)p_Var4[1]._M_nxt;
      local_40._M_len = (size_t)p_Var4[2]._M_nxt;
      iVar3 = CLI::std::
              _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&(this->pubids)._M_h,&local_40);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_true>
          ._M_cur == (__node_type *)0x0) {
        p_Var1 = p_Var4[1]._M_nxt;
        p_Var2 = p_Var4[2]._M_nxt;
        typeName._M_str = unaff_R12;
        typeName._M_len = unaff_RBX;
        type = getTypeFromString(typeName);
        name._M_str = (char *)p_Var1;
        name._M_len = (size_t)p_Var2;
        addPublication(this,name,type,(string_view)ZEXT816(0));
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
  }
  return;
}

Assistant:

void Player::generatePublications()
{
    for (auto& tname : tags) {
        if (pubids.find(tname.first) == pubids.end()) {
            addPublication(tname.first, helics::getTypeFromString(tname.second));
        }
    }
}